

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O2

void ht_add(htable *ht,void *new,size_t h)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (uint)h;
  bVar1 = (byte)ht->bits;
  uVar3 = ht->perfect_bit;
  while( true ) {
    uVar2 = uVar2 & ~(-1 << (bVar1 & 0x1f));
    if (ht->table[uVar2] < 2) break;
    uVar2 = uVar2 + 1;
    uVar3 = 0;
  }
  ht->table[uVar2] =
       ~ht->common_mask & (ulong)new |
       ~ht->perfect_bit & (h >> (bVar1 & 0x3f) ^ h) & ht->common_mask | uVar3;
  return;
}

Assistant:

static void ht_add(struct htable *ht, const void *new, size_t h)
{
	size_t i;
	uintptr_t perfect = ht->perfect_bit;

	i = hash_bucket(ht, h);

	while (entry_is_valid(ht->table[i])) {
		perfect = 0;
		i = (i + 1) & ((1 << ht->bits)-1);
	}
	ht->table[i] = make_hval(ht, new, get_hash_ptr_bits(ht, h)|perfect);
}